

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

double Vec_WecMemory(Vec_Wec_t *p)

{
  long lVar1;
  Vec_Int_t *pVVar2;
  int i;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (p != (Vec_Wec_t *)0x0) {
    lVar1 = (long)p->nCap << 4;
    auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    dVar3 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
    for (i = 0; i < p->nSize; i = i + 1) {
      pVVar2 = Vec_WecEntry(p,i);
      lVar1 = (long)pVVar2->nCap << 2;
      auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar4._0_8_ = lVar1;
      auVar4._12_4_ = 0x45300000;
      dVar3 = dVar3 + (auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
    }
    return dVar3;
  }
  return 0.0;
}

Assistant:

static inline double Vec_WecMemory( Vec_Wec_t * p )
{
    int i;
    double Mem;
    if ( p == NULL )  return 0.0;
    Mem = sizeof(Vec_Int_t) * Vec_WecCap(p);
    for ( i = 0; i < p->nSize; i++ )
        Mem += sizeof(int) * (size_t)Vec_IntCap( Vec_WecEntry(p, i) );
    return Mem;
}